

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task_etc(dxt_hc *this,uint64 data,void *param_3)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  color_cluster *this_00;
  byte bVar4;
  uchar uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  float *pfVar12;
  uchar *puVar13;
  long in_RSI;
  long in_RDI;
  float fVar14;
  uint error;
  uint8 s;
  uint8 s_best;
  uint error_best;
  uint p;
  uint32 selector;
  uint weight;
  color_quad_u8 *pixels;
  uint b;
  uint i;
  uint blockSize;
  vector<unsigned_int> *blocks;
  float endpoint_weight;
  int t;
  uint8 q;
  uint8 c_1;
  uint8 d1;
  uint8 d0;
  int c;
  color_quad_u8 endpoint;
  vector<unsigned_char> selectors;
  results results;
  params params;
  etc1_optimizer optimizer;
  color_cluster *cluster;
  uint iEnd;
  uint iCluster;
  int refine [4];
  int scan [3];
  uint8 delta [8] [2];
  uint num_tasks;
  uint in_stack_fffffffffffffd2c;
  params *in_stack_fffffffffffffd30;
  color_quad_u8 *in_stack_fffffffffffffd38;
  etc1_optimizer *in_stack_fffffffffffffd40;
  bool local_2b5;
  etc1_optimizer *in_stack_fffffffffffffdb0;
  byte local_232;
  byte local_231;
  uint local_230;
  uint local_22c;
  uint local_228;
  undefined4 in_stack_fffffffffffffde8;
  uint in_stack_fffffffffffffdec;
  uint local_210;
  int local_1f8;
  byte local_1f3;
  int local_1f0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1ec;
  vector<unsigned_char> local_1e8;
  ulong local_1d8;
  byte abStack_1d0 [8];
  uint local_1c8;
  uchar *local_1c0;
  EVP_PKEY_CTX local_1a0 [8];
  uint local_198;
  etc1_optimizer *local_190;
  undefined1 local_188;
  undefined8 *local_180;
  undefined4 local_178;
  undefined1 local_170;
  etc1_optimizer local_168;
  color_cluster *local_68;
  uint local_60;
  uint local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_44;
  undefined4 local_3c;
  byte local_38 [28];
  uint local_1c;
  long local_10;
  
  local_10 = in_RSI;
  uVar6 = task_pool::get_num_threads(*(task_pool **)(in_RDI + 0x898));
  local_1c = uVar6 + 1;
  local_38[0] = 2;
  local_38[1] = 8;
  local_38[2] = 5;
  local_38[3] = 0x11;
  local_38[4] = 9;
  local_38[5] = 0x1d;
  local_38[6] = 0xd;
  local_38[7] = 0x2a;
  local_38[8] = 0x12;
  local_38[9] = 0x3c;
  local_38[10] = 0x18;
  local_38[0xb] = 0x50;
  local_38[0xc] = 0x21;
  local_38[0xd] = 0x6a;
  local_38[0xe] = 0x2f;
  local_38[0xf] = 0xb7;
  local_44 = 0xffffffff;
  local_3c = 1;
  local_58 = 0xfffffffefffffffd;
  local_50 = 0x300000002;
  uVar6 = vector<crnlib::dxt_hc::color_cluster>::size
                    ((vector<crnlib::dxt_hc::color_cluster> *)(in_RDI + 0x868));
  local_5c = (uint)(((ulong)uVar6 * local_10) / (ulong)local_1c);
  uVar6 = vector<crnlib::dxt_hc::color_cluster>::size
                    ((vector<crnlib::dxt_hc::color_cluster> *)(in_RDI + 0x868));
  local_60 = (uint)(((ulong)uVar6 * (local_10 + 1)) / (ulong)local_1c);
  for (; local_5c < local_60; local_5c = local_5c + 1) {
    local_68 = vector<crnlib::dxt_hc::color_cluster>::operator[]
                         ((vector<crnlib::dxt_hc::color_cluster> *)(in_RDI + 0x868),local_5c);
    uVar6 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&local_68->pixels);
    if (uVar6 != 0) {
      etc1_optimizer::etc1_optimizer(in_stack_fffffffffffffdb0);
      etc1_optimizer::params::params(in_stack_fffffffffffffd30);
      local_188 = 0;
      local_170 = 0;
      etc1_optimizer::results::results((results *)0x1f2642);
      vector<crnlib::color_quad<unsigned_char,_int>_>::size(&local_68->pixels);
      vector<unsigned_char>::vector
                ((vector<unsigned_char> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
      in_stack_fffffffffffffdb0 =
           (etc1_optimizer *)
           vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(&local_68->pixels);
      local_190 = in_stack_fffffffffffffdb0;
      local_1c0 = vector<unsigned_char>::get_ptr(&local_1e8);
      local_1c8 = vector<crnlib::color_quad<unsigned_char,_int>_>::size(&local_68->pixels);
      local_198 = local_1c8;
      etc1_optimizer::init(&local_168,local_1a0);
      local_180 = &local_44;
      local_178 = 3;
      etc1_optimizer::compute
                ((etc1_optimizer *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      if (local_198 * 0x177 < local_1d8) {
        local_180 = &local_58;
        local_178 = 4;
        etc1_optimizer::compute
                  ((etc1_optimizer *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      }
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)&local_1ec.field_0);
      for (local_1f0 = 0; local_1f0 < 3; local_1f0 = local_1f0 + 1) {
        local_1ec.c[local_1f0] =
             abStack_1d0[local_1f0] << 3 | (byte)((int)(uint)abStack_1d0[local_1f0] >> 2);
      }
      bVar4 = (byte)abStack_1d0._4_4_;
      local_1ec.field_0.a = bVar4;
      local_68->first_endpoint = (uint)local_1ec;
      bVar2 = local_38[(ulong)bVar4 * 2];
      bVar4 = local_38[(ulong)bVar4 * 2 + 1];
      for (local_1f3 = 0; local_1f3 < 3; local_1f3 = local_1f3 + 1) {
        bVar3 = local_1ec.c[local_1f3];
        if (bVar4 < bVar3) {
          uVar5 = bVar3 - bVar4;
        }
        else {
          uVar5 = '\0';
        }
        local_68->color_values[0].field_0.c[local_1f3] = uVar5;
        if (bVar2 < bVar3) {
          uVar5 = bVar3 - bVar2;
        }
        else {
          uVar5 = '\0';
        }
        local_68->color_values[1].field_0.c[local_1f3] = uVar5;
        if ((int)(uint)bVar3 < (int)(0xff - (uint)bVar2)) {
          uVar5 = bVar3 + bVar2;
        }
        else {
          uVar5 = 0xff;
        }
        local_68->color_values[2].field_0.c[local_1f3] = uVar5;
        if ((int)(uint)bVar3 < (int)(0xff - (uint)bVar4)) {
          uVar5 = bVar3 + bVar4;
        }
        else {
          uVar5 = 0xff;
        }
        local_68->color_values[3].field_0.c[local_1f3] = uVar5;
      }
      for (local_1f8 = 0; local_1f8 < 4; local_1f8 = local_1f8 + 1) {
        local_68->color_values[local_1f8].field_0.field_0.a = 0xff;
      }
      iVar7 = color_quad<unsigned_char,_int>::get_luma(local_68->color_values + 3);
      iVar8 = color_quad<unsigned_char,_int>::get_luma(local_68->color_values);
      fVar14 = math::minimum<float>((float)(iVar7 - iVar8) / 100.0,1.0);
      fVar14 = powf(fVar14,2.7);
      this_00 = local_68;
      uVar9 = 0x10;
      if ((*(byte *)(in_RDI + 0x866) & 1) != 0) {
        uVar9 = 8;
      }
      for (local_210 = 0; uVar6 = vector<unsigned_int>::size(this_00->blocks), local_210 < uVar6;
          local_210 = local_210 + 1) {
        puVar11 = vector<unsigned_int>::operator[](this_00->blocks,local_210);
        in_stack_fffffffffffffdec = *puVar11;
        pfVar12 = vector<float>::operator[]
                            ((vector<float> *)(in_RDI + 0x648),in_stack_fffffffffffffdec);
        fVar1 = *pfVar12;
        puVar13 = vector<unsigned_char>::operator[]
                            ((vector<unsigned_char> *)(in_RDI + 0x658),in_stack_fffffffffffffdec);
        uVar10 = math::clamp<unsigned_int>
                           ((uint)(long)(fVar14 * 32768.0 * fVar1 *
                                        *(float *)(&DAT_00250b90 + (ulong)(*puVar13 != '\0') * 4)),1
                            ,0xffff);
        local_228 = 0;
        for (local_22c = 0; local_22c < uVar9; local_22c = local_22c + 1) {
          local_230 = 0xffffffff;
          local_231 = 0;
          for (local_232 = 0; local_232 < 4; local_232 = local_232 + 1) {
            uVar6 = crnlib::color::color_distance
                              (SUB81((ulong)in_stack_fffffffffffffd40 >> 0x18,0),
                               in_stack_fffffffffffffd38,(color_quad_u8 *)in_stack_fffffffffffffd30,
                               SUB41(in_stack_fffffffffffffd2c >> 0x18,0));
            if (uVar6 < local_230) {
              local_231 = local_232;
              local_230 = uVar6;
            }
          }
          local_228 = local_228 << 2 | (uint)local_231;
        }
        in_stack_fffffffffffffd40 = (etc1_optimizer *)(ulong)local_228;
        local_2b5 = (*(byte *)(in_RDI + 0x866) & 1) == 0 || (in_stack_fffffffffffffdec & 1) != 0;
        in_stack_fffffffffffffd30 =
             (params *)
             ((long)in_stack_fffffffffffffd40 << ((~local_2b5 & 1U) << 4 | 0x20) | (ulong)uVar10);
        in_stack_fffffffffffffd38 =
             (color_quad_u8 *)
             vector<unsigned_long_long>::operator[]
                       ((vector<unsigned_long_long> *)(in_RDI + 0x668),in_stack_fffffffffffffdec);
        *(params **)in_stack_fffffffffffffd38 = in_stack_fffffffffffffd30;
      }
      vector<unsigned_char>::~vector((vector<unsigned_char> *)in_stack_fffffffffffffd30);
      etc1_optimizer::~etc1_optimizer(in_stack_fffffffffffffd40);
    }
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task_etc(uint64 data, void*) {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint8 delta[8][2] = { {2, 8}, {5, 17}, {9, 29}, {13, 42}, {18, 60}, {24, 80}, {33, 106}, {47, 183} };
  int scan[] = {-1, 0, 1};
  int refine[] = {-3, -2, 2, 3};
  for (uint iCluster = m_color_clusters.size() * data / num_tasks, iEnd = m_color_clusters.size() * (data + 1) / num_tasks; iCluster < iEnd; iCluster++) {
    color_cluster& cluster = m_color_clusters[iCluster];
    if (cluster.pixels.size()) {
      etc1_optimizer optimizer;
      etc1_optimizer::params params;
      params.m_use_color4 = false;
      params.m_constrain_against_base_color5 = false;
      etc1_optimizer::results results;
      crnlib::vector<uint8> selectors(cluster.pixels.size());
      params.m_pSrc_pixels = cluster.pixels.get_ptr();
      results.m_pSelectors = selectors.get_ptr();
      results.m_n = params.m_num_src_pixels = cluster.pixels.size();
      optimizer.init(params, results);
      params.m_pScan_deltas = scan;
      params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
      optimizer.compute();
      if (results.m_error > 375 * params.m_num_src_pixels) {
        params.m_pScan_deltas = refine;
        params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
        optimizer.compute();
      }
      color_quad_u8 endpoint;
      for (int c = 0; c < 3; c++)
        endpoint.c[c] = results.m_block_color_unscaled.c[c] << 3 | results.m_block_color_unscaled.c[c] >> 2;
      endpoint.c[3] = results.m_block_inten_table;
      cluster.first_endpoint = endpoint.m_u32;
      for (uint8 d0 = delta[endpoint.c[3]][0], d1 = delta[endpoint.c[3]][1], c = 0; c < 3; c++) {
        uint8 q = endpoint.c[c];
        cluster.color_values[0].c[c] = q <= d1 ? 0 : q - d1;
        cluster.color_values[1].c[c] = q <= d0 ? 0 : q - d0;
        cluster.color_values[2].c[c] = q >= 255 - d0 ? 255 : q + d0;
        cluster.color_values[3].c[c] = q >= 255 - d1 ? 255 : q + d1;
      }
      for (int t = 0; t < 4; t++)
        cluster.color_values[t].c[3] = 0xFF;
      float endpoint_weight = powf(math::minimum((cluster.color_values[3].get_luma() - cluster.color_values[0].get_luma()) / 100.0f, 1.0f), 2.7f);

      crnlib::vector<uint>& blocks = cluster.blocks[cColor];
      uint blockSize = m_has_subblocks ? 8 : 16;
      for (uint i = 0; i < blocks.size(); i++) {
        uint b = blocks[i];
        color_quad_u8* pixels = m_has_subblocks ? ((color_quad_u8(*)[8])m_blocks)[b] : m_blocks[b];
        uint weight = (uint)(math::clamp<uint>(0x8000 * endpoint_weight * m_block_weights[b] * (m_block_encodings[b] ? 0.972f : 1.0f), 1, 0xFFFF));
        uint32 selector = 0;
        for (uint p = 0; p < blockSize; p++) {
          uint error_best = cUINT32_MAX;
          uint8 s_best = 0;
          for (uint8 s = 0; s < 4; s++) {
            uint error = color::color_distance(m_params.m_perceptual, pixels[p], cluster.color_values[s], false);
            if (error < error_best) {
              s_best = s;
              error_best = error;
            }
          }
          selector = selector << 2 | s_best;
        }
        m_block_selectors[cColor][b] = (uint64)selector << (!m_has_subblocks || (b & 1) ? 32 : 48) | weight;
      }
    }
  }
}